

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# araplanner.cpp
# Opt level: O1

int __thiscall
ARAPlanner::SetSearchGoalState
          (ARAPlanner *this,int SearchGoalStateID,ARASearchStateSpace_t *pSearchStateSpace)

{
  int iVar1;
  undefined4 extraout_var;
  
  if ((pSearchStateSpace->searchgoalstate == (CMDPSTATE *)0x0) ||
     (pSearchStateSpace->searchgoalstate->StateID != SearchGoalStateID)) {
    iVar1 = (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x1a])
                      (this,SearchGoalStateID,pSearchStateSpace);
    pSearchStateSpace->searchgoalstate = (CMDPSTATE *)CONCAT44(extraout_var,iVar1);
    pSearchStateSpace->eps_satisfied = 1000000000.0;
    pSearchStateSpace->bNewSearchIteration = true;
    this->pSearchStateSpace_->eps = this->finitial_eps;
    pSearchStateSpace->bReevaluatefvals = true;
  }
  return 1;
}

Assistant:

int ARAPlanner::SetSearchGoalState(int SearchGoalStateID, ARASearchStateSpace_t* pSearchStateSpace)
{
    if (pSearchStateSpace->searchgoalstate == NULL ||
        pSearchStateSpace->searchgoalstate->StateID != SearchGoalStateID)
    {
        pSearchStateSpace->searchgoalstate = GetState(SearchGoalStateID, pSearchStateSpace);

        //should be new search iteration
        pSearchStateSpace->eps_satisfied = INFINITECOST;
        pSearchStateSpace->bNewSearchIteration = true;
        pSearchStateSpace_->eps = this->finitial_eps;

#if USE_HEUR
        //recompute heuristic for the heap if heuristics is used
        pSearchStateSpace->bReevaluatefvals = true;
#endif
    }

    return 1;
}